

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTElements.hpp
# Opt level: O0

FieldType * __thiscall FieldType::getName_abi_cxx11_(FieldType *this)

{
  bool bVar1;
  size_type sVar2;
  string *in_RSI;
  undefined1 local_90 [64];
  reference local_50;
  FieldType *itr;
  iterator __end2;
  iterator __begin2;
  vector<FieldType,_std::allocator<FieldType>_> *__range2;
  FieldType *this_local;
  string *result;
  
  std::__cxx11::string::string((string *)this,in_RSI);
  sVar2 = std::vector<FieldType,_std::allocator<FieldType>_>::size
                    ((vector<FieldType,_std::allocator<FieldType>_> *)(in_RSI + 0x20));
  if (sVar2 != 0) {
    std::__cxx11::string::operator+=((string *)this,"<");
    __end2 = std::vector<FieldType,_std::allocator<FieldType>_>::begin
                       ((vector<FieldType,_std::allocator<FieldType>_> *)(in_RSI + 0x20));
    itr = (FieldType *)
          std::vector<FieldType,_std::allocator<FieldType>_>::end
                    ((vector<FieldType,_std::allocator<FieldType>_> *)(in_RSI + 0x20));
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<FieldType_*,_std::vector<FieldType,_std::allocator<FieldType>_>_>
                                       *)&itr), bVar1) {
      local_50 = __gnu_cxx::
                 __normal_iterator<FieldType_*,_std::vector<FieldType,_std::allocator<FieldType>_>_>
                 ::operator*(&__end2);
      getName_abi_cxx11_((FieldType *)local_90);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_90 + 0x20),local_90);
      std::__cxx11::string::operator+=((string *)this,(string *)(local_90 + 0x20));
      std::__cxx11::string::~string((string *)(local_90 + 0x20));
      std::__cxx11::string::~string((string *)local_90);
      __gnu_cxx::__normal_iterator<FieldType_*,_std::vector<FieldType,_std::allocator<FieldType>_>_>
      ::operator++(&__end2);
    }
    std::__cxx11::string::pop_back();
    std::__cxx11::string::pop_back();
    std::__cxx11::string::operator+=((string *)this,">");
  }
  return this;
}

Assistant:

std::string getName() {
        std::string result = name;
        if (this->templateTypes.size()) {
            result += "<";
            for (auto& itr : this->templateTypes) {
                result += itr.getName() + ", ";
            }
            result.pop_back();
            result.pop_back();
            result += ">";
        }
        return result;
    }